

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmWorkerPool.cxx
# Opt level: O3

void cmWorkerPoolInternal::UVSlotBegin(uv_async_t *handle)

{
  cmWorkerPoolInternal *pcVar1;
  _Head_base<0UL,_uv_loop_s_*,_false> uvLoop;
  __uniq_ptr_impl<cmWorkerPoolWorker,_std::default_delete<cmWorkerPoolWorker>_> _Var2;
  _Head_base<0UL,_cmWorkerPoolWorker_*,_false> this;
  uint uVar3;
  ulong __n;
  uint local_5c;
  __uniq_ptr_impl<cmWorkerPoolWorker,_std::default_delete<cmWorkerPoolWorker>_> local_58;
  undefined8 local_50;
  ulong local_48;
  cmWorkerPoolInternal *local_40;
  thread local_38;
  
  pcVar1 = (cmWorkerPoolInternal *)handle->data;
  __n = (ulong)pcVar1->Pool->ThreadCount_;
  std::
  vector<std::unique_ptr<cmWorkerPoolWorker,_std::default_delete<cmWorkerPoolWorker>_>,_std::allocator<std::unique_ptr<cmWorkerPoolWorker,_std::default_delete<cmWorkerPoolWorker>_>_>_>
  ::reserve(&pcVar1->Workers,__n);
  if (__n != 0) {
    local_48 = __n;
    do {
      uvLoop._M_head_impl =
           (pcVar1->UVLoop)._M_t.super___uniq_ptr_impl<uv_loop_s,_std::default_delete<uv_loop_s>_>.
           _M_t.super__Tuple_impl<0UL,_uv_loop_s_*,_std::default_delete<uv_loop_s>_>.
           super__Head_base<0UL,_uv_loop_s_*,_false>._M_head_impl;
      this._M_head_impl = (cmWorkerPoolWorker *)operator_new(0x78);
      cmWorkerPoolWorker::cmWorkerPoolWorker(this._M_head_impl,uvLoop._M_head_impl);
      local_58._M_t.
      super__Tuple_impl<0UL,_cmWorkerPoolWorker_*,_std::default_delete<cmWorkerPoolWorker>_>.
      super__Head_base<0UL,_cmWorkerPoolWorker_*,_false>._M_head_impl =
           (tuple<cmWorkerPoolWorker_*,_std::default_delete<cmWorkerPoolWorker>_>)
           (tuple<cmWorkerPoolWorker_*,_std::default_delete<cmWorkerPoolWorker>_>)this._M_head_impl;
      std::
      vector<std::unique_ptr<cmWorkerPoolWorker,std::default_delete<cmWorkerPoolWorker>>,std::allocator<std::unique_ptr<cmWorkerPoolWorker,std::default_delete<cmWorkerPoolWorker>>>>
      ::emplace_back<std::unique_ptr<cmWorkerPoolWorker,std::default_delete<cmWorkerPoolWorker>>>
                ((vector<std::unique_ptr<cmWorkerPoolWorker,std::default_delete<cmWorkerPoolWorker>>,std::allocator<std::unique_ptr<cmWorkerPoolWorker,std::default_delete<cmWorkerPoolWorker>>>>
                  *)&pcVar1->Workers,
                 (unique_ptr<cmWorkerPoolWorker,_std::default_delete<cmWorkerPoolWorker>_> *)
                 &local_58);
      std::unique_ptr<cmWorkerPoolWorker,_std::default_delete<cmWorkerPoolWorker>_>::~unique_ptr
                ((unique_ptr<cmWorkerPoolWorker,_std::default_delete<cmWorkerPoolWorker>_> *)
                 &local_58);
      uVar3 = (int)__n - 1;
      __n = (ulong)uVar3;
    } while (uVar3 != 0);
    local_5c = 0;
    do {
      _Var2._M_t.
      super__Tuple_impl<0UL,_cmWorkerPoolWorker_*,_std::default_delete<cmWorkerPoolWorker>_>.
      super__Head_base<0UL,_cmWorkerPoolWorker_*,_false>._M_head_impl =
           (pcVar1->Workers).
           super__Vector_base<std::unique_ptr<cmWorkerPoolWorker,_std::default_delete<cmWorkerPoolWorker>_>,_std::allocator<std::unique_ptr<cmWorkerPoolWorker,_std::default_delete<cmWorkerPoolWorker>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start[local_5c]._M_t.
           super___uniq_ptr_impl<cmWorkerPoolWorker,_std::default_delete<cmWorkerPoolWorker>_>._M_t;
      local_58._M_t.
      super__Tuple_impl<0UL,_cmWorkerPoolWorker_*,_std::default_delete<cmWorkerPoolWorker>_>.
      super__Head_base<0UL,_cmWorkerPoolWorker_*,_false>._M_head_impl =
           (tuple<cmWorkerPoolWorker_*,_std::default_delete<cmWorkerPoolWorker>_>)Work;
      local_50 = 0;
      local_40 = pcVar1;
      std::thread::
      thread<void(cmWorkerPoolInternal::*)(unsigned_int),cmWorkerPoolInternal*,unsigned_int&,void>
                (&local_38,(offset_in_cmWorkerPoolInternal_to_subr *)&local_58,&local_40,&local_5c);
      if (*(long *)((long)_Var2._M_t.
                          super__Tuple_impl<0UL,_cmWorkerPoolWorker_*,_std::default_delete<cmWorkerPoolWorker>_>
                          .super__Head_base<0UL,_cmWorkerPoolWorker_*,_false>._M_head_impl + 0x70)
          != 0) {
        std::terminate();
      }
      ((id *)((long)_Var2._M_t.
                    super__Tuple_impl<0UL,_cmWorkerPoolWorker_*,_std::default_delete<cmWorkerPoolWorker>_>
                    .super__Head_base<0UL,_cmWorkerPoolWorker_*,_false>._M_head_impl + 0x70))->
      _M_thread = (native_handle_type)local_38._M_id._M_thread;
      local_5c = local_5c + 1;
    } while (local_5c != (uint)local_48);
  }
  ::cm::uv_handle_ptr_base_<uv_async_s>::reset
            ((uv_handle_ptr_base_<uv_async_s> *)&pcVar1->UVRequestBegin);
  return;
}

Assistant:

void cmWorkerPoolInternal::UVSlotBegin(uv_async_t* handle)
{
  auto& gint = *reinterpret_cast<cmWorkerPoolInternal*>(handle->data);
  // Create worker threads
  {
    unsigned int const num = gint.Pool->ThreadCount();
    // Create workers
    gint.Workers.reserve(num);
    for (unsigned int ii = 0; ii != num; ++ii) {
      gint.Workers.emplace_back(
        cm::make_unique<cmWorkerPoolWorker>(*gint.UVLoop));
    }
    // Start worker threads
    for (unsigned int ii = 0; ii != num; ++ii) {
      gint.Workers[ii]->SetThread(
        std::thread(&cmWorkerPoolInternal::Work, &gint, ii));
    }
  }
  // Destroy begin request
  gint.UVRequestBegin.reset();
}